

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O3

InsertResult * __thiscall
stick::HashMap<stick::String,_unsigned_long,_stick::DefaultHash>::insert
          (InsertResult *__return_storage_ptr__,
          HashMap<stick::String,_unsigned_long,_stick::DefaultHash> *this,KeyValuePair *_val)

{
  Size SVar1;
  Allocator *pAVar2;
  ValueType VVar3;
  int iVar4;
  Size SVar5;
  undefined4 extraout_var;
  undefined8 *puVar6;
  ulong uVar7;
  Bucket *pBVar8;
  Node *pNVar9;
  ulong uVar10;
  Node **ppNVar11;
  bool bVar12;
  ulong uVar13;
  Size extraout_RDX;
  Node *pNVar14;
  Node *pNVar15;
  Node *this_00;
  ulong uVar16;
  char *__s1;
  float fVar17;
  Size local_58;
  char *local_40;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  SVar5 = DefaultHash<stick::String>::operator()
                    ((DefaultHash<stick::String> *)&this->field_0x24,&_val->key);
  uVar13 = SVar5 % this->m_bucketCount;
  pBVar8 = this->m_buckets;
  pNVar15 = pBVar8[uVar13].first;
  SVar5 = (_val->key).m_length;
  if (pNVar15 == (Node *)0x0) {
    __s1 = (_val->key).m_cStr;
    pNVar14 = (Node *)0x0;
  }
  else {
    __s1 = (_val->key).m_cStr;
    pNVar14 = (Node *)0x0;
    do {
      this_00 = pNVar15;
      SVar1 = (this_00->kv).key.m_length;
      if ((SVar5 == 0) || (SVar1 == 0)) {
        if (SVar1 == 0 && SVar5 == 0) goto LAB_0010fc36;
      }
      else {
        iVar4 = strcmp(__s1,(this_00->kv).key.m_cStr);
        if (iVar4 == 0) {
LAB_0010fc36:
          if (this_00->prev != pNVar14) {
            __assert_fail("n->prev == _prev",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/HashMap.hpp"
                          ,0x27d,
                          "void stick::HashMap<stick::String, unsigned long>::findHelper(Size, const KeyType &, Node *&, Node *&) const [K = stick::String, V = unsigned long, H = stick::DefaultHash]"
                         );
          }
          (this_00->kv).value = _val->value;
          bVar12 = false;
          goto LAB_0010fe5d;
        }
      }
      pNVar15 = this_00->next;
      pNVar14 = this_00;
    } while (this_00->next != (Node *)0x0);
  }
  pAVar2 = (_val->key).m_allocator;
  if (__s1 == (char *)0x0) {
    local_40 = (char *)0x0;
    local_58 = 0;
  }
  else {
    iVar4 = (*pAVar2->_vptr_Allocator[2])(pAVar2,SVar5 + 1,1);
    local_40 = (char *)CONCAT44(extraout_var,iVar4);
    memset(local_40,0,SVar5 + 1);
    if (local_40 == (char *)0x0) {
      __assert_fail("m_cStr != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/String.hpp"
                    ,0x1a0,"void stick::String::reserve(Size)");
    }
    strcpy(local_40,(_val->key).m_cStr);
    local_58 = SVar5;
  }
  VVar3 = _val->value;
  iVar4 = (*this->m_alloc->_vptr_Allocator[2])(this->m_alloc,0x50,8);
  puVar6 = (undefined8 *)CONCAT44(extraout_var_00,iVar4);
  *puVar6 = 0x50;
  this_00 = (Node *)(puVar6 + 1);
  Node::Node(this_00);
  puVar6[8] = uVar13;
  SVar1 = this->m_nextNodeID;
  this->m_nextNodeID = SVar1 + 1;
  puVar6[9] = SVar1;
  if (puVar6[1] != 0) {
    (**(code **)(*(long *)puVar6[4] + 0x18))();
  }
  (this_00->kv).key.m_cStr = local_40;
  puVar6[4] = pAVar2;
  puVar6[2] = SVar5;
  puVar6[3] = local_58;
  puVar6[5] = VVar3;
  if (pNVar14 == (Node *)0x0) {
    ppNVar11 = &pBVar8[uVar13].first;
  }
  else {
    puVar6[6] = pNVar14;
    ppNVar11 = &pNVar14->next;
  }
  *ppNVar11 = this_00;
  uVar10 = this->m_bucketCount;
  uVar7 = this->m_count + 1;
  this->m_count = uVar7;
  fVar17 = (float)uVar7 / (float)uVar10;
  bVar12 = true;
  if ((float)this->m_maxLoadFactor <= fVar17 && fVar17 != (float)this->m_maxLoadFactor) {
    uVar7 = uVar10 * 2;
    iVar4 = (*this->m_alloc->_vptr_Allocator[2])(this->m_alloc,uVar10 << 4,8);
    pBVar8 = (Bucket *)CONCAT44(extraout_var_01,iVar4);
    if (uVar7 != 0) {
      memset(pBVar8,0,uVar10 << 4);
    }
    uVar10 = this->m_bucketCount;
    if (uVar10 != 0) {
      uVar16 = 0;
      do {
        pNVar15 = this->m_buckets[uVar16].first;
        if (pNVar15 != (Node *)0x0) {
          do {
            SVar5 = DefaultHash<stick::String>::operator()
                              ((DefaultHash<stick::String> *)&this->field_0x24,(String *)pNVar15);
            pNVar14 = pBVar8[SVar5 % uVar7].first;
            if (pBVar8[SVar5 % uVar7].first == (Node *)0x0) {
              ppNVar11 = &pBVar8[SVar5 % uVar7].first;
              pNVar9 = (Node *)0x0;
            }
            else {
              do {
                pNVar9 = pNVar14;
                pNVar14 = pNVar9->next;
              } while (pNVar9->next != (Node *)0x0);
              ppNVar11 = &pNVar9->next;
            }
            pNVar14 = pNVar15->next;
            *ppNVar11 = pNVar15;
            pNVar15->prev = pNVar9;
            pNVar15->next = (Node *)0x0;
            pNVar15 = pNVar14;
          } while (pNVar14 != (Node *)0x0);
          uVar10 = this->m_bucketCount;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < uVar10);
    }
    (*this->m_alloc->_vptr_Allocator[3])();
    this->m_bucketAllocationSize = extraout_RDX;
    this->m_buckets = pBVar8;
    this->m_bucketCount = uVar7;
    bVar12 = true;
  }
LAB_0010fe5d:
  (__return_storage_ptr__->iterator).map = this;
  (__return_storage_ptr__->iterator).bucketIndex = uVar13;
  (__return_storage_ptr__->iterator).node = this_00;
  __return_storage_ptr__->inserted = bVar12;
  return __return_storage_ptr__;
}

Assistant:

inline InsertResult insert(KeyValuePair && _val)
    {
        Size bi = bucketIndex(_val.key);
        Bucket & b = m_buckets[bi];

        // check if the key allready exists
        Node *n, *prev;
        findHelper(bi, _val.key, n, prev);

        // the key allready exists, change the value
        if (n)
        {
            STICK_ASSERT(prev == n->prev);
            n->kv.value = std::move(_val.value);
            return { Iter(*this, bi, n), false };
        }
        else
        {
            // otherwise create the node n stuff
            n = createNode({ _val.key, std::move(_val.value) }, bi);
            if (prev)
            {
                n->prev = prev;
                prev->next = n;
            }
            else
            {
                b.first = n;
            }
            ++m_count;
        }

        Float32 lf = loadFactor();
        if (lf > m_maxLoadFactor)
        {
            rehash(m_bucketCount * 2);
        }

        return { Iter(*this, bi, n), true };
    }